

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_map_delete(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSMapState *s;
  JSMapRecord *mr;
  JSValueUnion JVar1;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  JSValue JVar4;
  JSValue key;
  
  s = (JSMapState *)JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  if (s == (JSMapState *)0x0) {
    JVar2.float64 = 2.96439387504748e-323;
    JVar3.float64 = 0.0;
  }
  else {
    JVar3.float64 = 0.0;
    JVar1 = (JSValueUnion)argv->tag;
    JVar2.ptr = (argv->u).ptr;
    if (((ulong)(argv->u).ptr & 0x7fffffffffffffff) == 0 && (argv->tag & 0xffffffffU) == 7) {
      JVar1.float64 = JVar3.float64;
      JVar2.float64 = JVar3.float64;
    }
    key.tag = (int64_t)JVar1.ptr;
    key.u.ptr = JVar2.ptr;
    mr = map_find_record(ctx,s,key);
    if (mr == (JSMapRecord *)0x0) {
      JVar2.float64 = 4.94065645841247e-324;
    }
    else {
      map_delete_record(ctx->rt,s,mr);
      JVar2.float64 = 4.94065645841247e-324;
      JVar3.float64 = JVar2.float64;
    }
  }
  JVar4.tag = (int64_t)JVar2.ptr;
  JVar4.u.ptr = JVar3.ptr;
  return JVar4;
}

Assistant:

static JSValue js_map_delete(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    mr = map_find_record(ctx, s, key);
    if (!mr)
        return JS_FALSE;
    map_delete_record(ctx->rt, s, mr);
    return JS_TRUE;
}